

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O3

void __thiscall salsa20::print_key_array(salsa20 *this)

{
  ostream *poVar1;
  long lVar2;
  array<unsigned_int,_16UL> *__range1;
  
  lVar2 = 0;
  do {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return;
}

Assistant:

void salsa20::print_key_array() const
{
    for (const auto &v : m_array)
        std::cout << v << " ";
    std::cout << std::endl;
}